

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_IsDescendantOneof_Test::TestBody
          (GeneratedMessageReflection_IsDescendantOneof_Test *this)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *pVVar2;
  undefined8 uVar3;
  TestAllTypes_NestedMessage *pTVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  TestOneof msg1;
  TestOneof msg2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  TestOneof local_50;
  TestOneof local_30;
  
  proto2_unittest::TestOneof::TestOneof(&local_50,(Arena *)0x0);
  proto2_unittest::TestOneof::TestOneof(&local_30,(Arena *)0x0);
  if (local_50.field_0._impl_._oneof_case_[0] != 3) {
    proto2_unittest::TestOneof::clear_foo(&local_50);
    local_50.field_0._impl_._oneof_case_[0] = (uint32_t  [1])3;
    if ((local_50.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_50.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_50.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe)
      ;
    }
    local_50.field_0._impl_.foo_ =
         (FooUnion)
         Arena::DefaultConstruct<proto2_unittest::TestAllTypes>
                   ((Arena *)local_50.super_Message.super_MessageLite._internal_metadata_.ptr_);
  }
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)local_50.field_0._impl_.foo_);
  proto2_unittest::TestOneof::CopyFrom(&local_30,&local_50);
  uVar3 = local_50.field_0._impl_.foo_;
  if (local_50.field_0._impl_._oneof_case_[0] != 3) {
    uVar3 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
  }
  pTVar4 = (((TestAllTypes *)uVar3)->field_0)._impl_.optional_nested_message_;
  if (pTVar4 == (TestAllTypes_NestedMessage *)0x0) {
    pTVar4 = (TestAllTypes_NestedMessage *)
             &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_80[0] = (internal)
                protobuf::internal::IsDescendant(&local_50.super_Message,&pTVar4->super_Message);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_80[0]) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,local_80,
               (AssertionResult *)"IsDescendant(msg1, msg1.foo_message().optional_nested_message())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6d6,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  uVar3 = local_50.field_0._impl_.foo_;
  if (local_50.field_0._impl_._oneof_case_[0] != 3) {
    uVar3 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
  }
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                     (&(((TestAllTypes *)uVar3)->field_0)._impl_.repeated_foreign_message_.
                       super_RepeatedPtrFieldBase,0);
  local_80[0] = (internal)
                protobuf::internal::IsDescendant(&local_50.super_Message,&pVVar2->super_Message);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_80[0]) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,local_80,
               (AssertionResult *)
               "IsDescendant(msg1, msg1.foo_message().repeated_foreign_message(0))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6d8,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  uVar3 = local_30.field_0._impl_.foo_;
  if (local_30.field_0._impl_._oneof_case_[0] != 3) {
    uVar3 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
  }
  pTVar4 = (((TestAllTypes *)uVar3)->field_0)._impl_.optional_nested_message_;
  if (pTVar4 == (TestAllTypes_NestedMessage *)0x0) {
    pTVar4 = (TestAllTypes_NestedMessage *)
             &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  bVar1 = protobuf::internal::IsDescendant(&local_50.super_Message,&pTVar4->super_Message);
  local_80[0] = (internal)!bVar1;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,local_80,
               (AssertionResult *)"IsDescendant(msg1, msg2.foo_message().optional_nested_message())"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6db,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if (local_30.field_0._impl_._oneof_case_[0] != 3) {
    local_30.field_0._impl_.foo_ = (FooUnion)&proto2_unittest::_TestAllTypes_default_instance_;
  }
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                     (&(((TestAllTypes *)local_30.field_0._impl_.foo_)->field_0)._impl_.
                       repeated_foreign_message_.super_RepeatedPtrFieldBase,0);
  bVar1 = protobuf::internal::IsDescendant(&local_50.super_Message,&pVVar2->super_Message);
  local_80[0] = (internal)!bVar1;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,local_80,
               (AssertionResult *)
               "IsDescendant(msg1, msg2.foo_message().repeated_foreign_message(0))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x6dd,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  proto2_unittest::TestOneof::~TestOneof(&local_30);
  proto2_unittest::TestOneof::~TestOneof(&local_50);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, IsDescendantOneof) {
  unittest::TestOneof msg1, msg2;
  TestUtil::SetAllFields(msg1.mutable_foo_message());
  msg2 = msg1;

  EXPECT_TRUE(IsDescendant(msg1, msg1.foo_message().optional_nested_message()));
  EXPECT_TRUE(
      IsDescendant(msg1, msg1.foo_message().repeated_foreign_message(0)));

  EXPECT_FALSE(
      IsDescendant(msg1, msg2.foo_message().optional_nested_message()));
  EXPECT_FALSE(
      IsDescendant(msg1, msg2.foo_message().repeated_foreign_message(0)));
}